

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

QString * __thiscall
QXmlStreamReader::readElementText
          (QString *__return_storage_ptr__,QXmlStreamReader *this,ReadElementTextBehaviour behaviour
          )

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> _Var1;
  TokenType TVar2;
  char16_t *pcVar3;
  long size;
  QChar *unicode;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->type == StartElement) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
switchD_00396a02_caseD_7:
    TVar2 = readNext(this);
    switch(TVar2) {
    case StartElement:
      if (behaviour == IncludeChildElements) {
        readElementText(&local_50,this,IncludeChildElements);
        QString::append(__return_storage_ptr__,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto switchD_00396a02_caseD_7;
      }
      if (behaviour == SkipChildElements) {
        skipCurrentElement(this);
        goto switchD_00396a02_caseD_7;
      }
      break;
    case EndElement:
      goto switchD_00396a02_caseD_5;
    case Characters:
    case EntityReference:
      goto switchD_00396a02_caseD_6;
    case Comment:
    case ProcessingInstruction:
      goto switchD_00396a02_caseD_7;
    }
    if ((behaviour == ErrorOnUnexpectedElement) || ((_Var1._M_head_impl)->error != NoError)) {
      if ((_Var1._M_head_impl)->error == NoError) {
        QCoreApplication::translate
                  (&local_50,"QXmlStream","Expected character data.",(char *)0x0,-1);
        (_Var1._M_head_impl)->error = UnexpectedElementError;
        QString::operator=(&(_Var1._M_head_impl)->errorString,&local_50);
        (_Var1._M_head_impl)->type = Invalid;
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      goto switchD_00396a02_caseD_5;
    }
    goto switchD_00396a02_caseD_7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_00396be5:
  __stack_chk_fail();
switchD_00396a02_caseD_6:
  size = (long)((_Var1._M_head_impl)->text).m_string;
  if (size == 0) {
    unicode = (QChar *)0x0;
  }
  else {
    pcVar3 = *(char16_t **)(size + 8);
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = &QString::_empty;
    }
    unicode = (QChar *)(pcVar3 + *(qsizetype *)((long)&(_Var1._M_head_impl)->text + 8));
  }
  if (size != 0) {
    size = *(qsizetype *)((long)&(_Var1._M_head_impl)->text + 0x10);
  }
  QString::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,unicode,size);
  goto switchD_00396a02_caseD_7;
switchD_00396a02_caseD_5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  goto LAB_00396be5;
}

Assistant:

QString QXmlStreamReader::readElementText(ReadElementTextBehaviour behaviour)
{
    Q_D(QXmlStreamReader);
    if (isStartElement()) {
        QString result;
        forever {
            switch (readNext()) {
            case Characters:
            case EntityReference:
                result.insert(result.size(), d->text);
                break;
            case EndElement:
                return result;
            case ProcessingInstruction:
            case Comment:
                break;
            case StartElement:
                if (behaviour == SkipChildElements) {
                    skipCurrentElement();
                    break;
                } else if (behaviour == IncludeChildElements) {
                    result += readElementText(behaviour);
                    break;
                }
                Q_FALLTHROUGH();
            default:
                if (d->error || behaviour == ErrorOnUnexpectedElement) {
                    if (!d->error)
                        d->raiseError(UnexpectedElementError, QXmlStream::tr("Expected character data."));
                    return result;
                }
            }
        }